

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BuildLog *this_01;
  Metrics *this_02;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  Metric *pMVar9;
  bool bVar10;
  const_iterator o;
  pointer ppNVar11;
  allocator<char> local_119;
  string *local_118;
  string rspfile;
  int end_time;
  int start_time;
  string deps_type;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ScopedMetric metrics_h_scoped;
  
  local_118 = err;
  if (FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar3 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                 metrics_h_metric);
    this_02 = g_metrics;
    if (iVar3 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar9 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&deps_type,"FinishCommand",(allocator<char> *)&deps_prefix);
        pMVar9 = Metrics::NewMetric(this_02,&deps_type);
        std::__cxx11::string::~string((string *)&deps_type);
      }
      FinishCommand::metrics_h_metric = pMVar9;
      __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps_prefix,"deps",(allocator<char> *)&rspfile);
  Edge::GetBinding(&deps_type,this_00,&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"msvc_deps_prefix",(allocator<char> *)&local_60);
  Edge::GetBinding(&deps_prefix,this_00,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (deps_type._M_string_length != 0) {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_local_buf[0] = '\0';
    bVar1 = ExtractDeps(this,result,&deps_type,&deps_prefix,&deps_nodes,&rspfile);
    if ((!bVar1) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::append((string *)&result->output);
      result->status = ExitFailure;
    }
    std::__cxx11::string::~string((string *)&rspfile);
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&start_time,
             &end_time);
  if (result->status != ExitSuccess) {
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_118);
    goto LAB_00109163;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"restat",(allocator<char> *)&local_60);
  bVar1 = Edge::GetBindingBool(this_00,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (this->config_[4] == (BuildConfig)0x0) {
    lVar4 = 0;
    bVar10 = false;
    for (ppNVar11 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar11 !=
        (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar11 = ppNVar11 + 1) {
      lVar7 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar11,local_118);
      if (lVar7 == -1) goto LAB_00109161;
      if (lVar4 < lVar7) {
        lVar4 = lVar7;
      }
      if ((*ppNVar11)->mtime_ == lVar7 && bVar1) {
        bVar2 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar11,local_118);
        bVar10 = true;
        if (!bVar2) goto LAB_00109161;
      }
    }
    lVar7 = lVar4;
    if (!bVar10) goto LAB_00108e5f;
    lVar7 = 0;
    for (ppNVar11 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar11 !=
        (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
        ppNVar11 = ppNVar11 + 1) {
      lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,*ppNVar11,local_118);
      if (lVar8 == -1) goto LAB_00109161;
      if (lVar7 < lVar8) {
        lVar7 = lVar8;
      }
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&rspfile,this_00);
    if (lVar7 == 0) {
      lVar7 = 0;
LAB_0010913a:
      this->status_->total_edges_ = (this->plan_).command_edges_;
      bVar1 = true;
    }
    else {
      if ((deps_type._M_string_length != 0) || (rspfile._M_string_length == 0)) goto LAB_0010913a;
      lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                        (this->disk_interface_,&rspfile,local_118);
      if (lVar7 < lVar8) {
        lVar7 = lVar8;
      }
      if (lVar8 != -1) goto LAB_0010913a;
      bVar1 = false;
      lVar7 = lVar4;
    }
    std::__cxx11::string::~string((string *)&rspfile);
    if (bVar1) goto LAB_00108e5f;
  }
  else {
    lVar7 = 0;
LAB_00108e5f:
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_118);
    if (bVar1) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&rspfile,this_00);
      if ((rspfile._M_string_length != 0) && (g_keep_rsp == false)) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&rspfile);
      }
      this_01 = (this->scan_).build_log_;
      if (this_01 == (BuildLog *)0x0) {
LAB_00108ed5:
        bVar1 = true;
        if ((deps_type._M_string_length != 0) && (this->config_[4] == (BuildConfig)0x0)) {
          ppNVar11 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if (ppNVar11 ==
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                          ,0x40b,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          do {
            bVar1 = ppNVar11 ==
                    (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
            if (bVar1) goto LAB_001090e2;
            lVar4 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                              (this->disk_interface_,*ppNVar11,local_118);
            if (lVar4 == -1) goto LAB_001090e2;
            bVar1 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar11,lVar4,
                                        &deps_nodes);
            ppNVar11 = ppNVar11 + 1;
          } while (bVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"Error writing to deps log: ",&local_119);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          std::operator+(&local_60,&local_80,pcVar6);
          goto LAB_001090b6;
        }
      }
      else {
        bVar1 = BuildLog::RecordCommand(this_01,this_00,start_time,end_time,lVar7);
        if (bVar1) goto LAB_00108ed5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Error writing to build log: ",&local_119);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        std::operator+(&local_60,&local_80,pcVar6);
LAB_001090b6:
        std::__cxx11::string::operator=((string *)local_118,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        bVar1 = false;
      }
LAB_001090e2:
      std::__cxx11::string::~string((string *)&rspfile);
      goto LAB_00109163;
    }
  }
LAB_00109161:
  bVar1 = false;
LAB_00109163:
  std::__cxx11::string::~string((string *)&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_type);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar1;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}